

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

void testing::internal::ShuffleRange<int>
               (Random *random,int begin,int end,vector<int,_std::allocator<int>_> *v)

{
  pointer piVar1;
  UInt32 UVar2;
  ostream *poVar3;
  int iVar4;
  long lVar5;
  GTestLog local_38;
  GTestLog local_34;
  
  iVar4 = (int)((ulong)((long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  if ((begin < 0) || (iVar4 < begin)) {
    GTestLog::GTestLog(&local_38,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/inani47[P]8-puzzle-BFS/vendor/googletest/googletest/src/gtest-internal-inl.h"
                       ,0x13b);
    poVar3 = std::operator<<((ostream *)&std::cerr,"Condition 0 <= begin && begin <= size failed. ")
    ;
    poVar3 = std::operator<<(poVar3,"Invalid shuffle range start ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,begin);
    poVar3 = std::operator<<(poVar3,": must be in range [0, ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
    std::operator<<(poVar3,"].");
    GTestLog::~GTestLog(&local_38);
  }
  if ((end < begin) || (iVar4 < end)) {
    GTestLog::GTestLog(&local_34,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/inani47[P]8-puzzle-BFS/vendor/googletest/googletest/src/gtest-internal-inl.h"
                       ,0x13e);
    poVar3 = std::operator<<((ostream *)&std::cerr,"Condition begin <= end && end <= size failed. ")
    ;
    poVar3 = std::operator<<(poVar3,"Invalid shuffle range finish ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,end);
    poVar3 = std::operator<<(poVar3,": must be in range [");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,begin);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
    std::operator<<(poVar3,"].");
    GTestLog::~GTestLog(&local_34);
  }
  for (lVar5 = (long)(end - begin); 1 < lVar5; lVar5 = lVar5 + -1) {
    UVar2 = Random::Generate(random,(UInt32)lVar5);
    piVar1 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    iVar4 = piVar1[(int)(UVar2 + begin)];
    piVar1[(int)(UVar2 + begin)] = piVar1[(long)begin + lVar5 + -1];
    piVar1[(long)begin + lVar5 + -1] = iVar4;
  }
  return;
}

Assistant:

void ShuffleRange(internal::Random* random, int begin, int end,
                  std::vector<E>* v) {
  const int size = static_cast<int>(v->size());
  GTEST_CHECK_(0 <= begin && begin <= size)
      << "Invalid shuffle range start " << begin << ": must be in range [0, "
      << size << "].";
  GTEST_CHECK_(begin <= end && end <= size)
      << "Invalid shuffle range finish " << end << ": must be in range ["
      << begin << ", " << size << "].";

  // Fisher-Yates shuffle, from
  // http://en.wikipedia.org/wiki/Fisher-Yates_shuffle
  for (int range_width = end - begin; range_width >= 2; range_width--) {
    const int last_in_range = begin + range_width - 1;
    const int selected = begin + random->Generate(range_width);
    std::swap((*v)[selected], (*v)[last_in_range]);
  }
}